

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug_info_manager.cpp
# Opt level: O3

uint32_t spvtools::opt::analysis::AddNewConstInGlobals(IRContext *context,uint32_t const_value)

{
  TypeManager *this;
  uint32_t res_id;
  uint32_t ty_id;
  Instruction *this_00;
  Type *type;
  string message;
  size_type __dnew;
  char *local_a8;
  undefined1 local_a0 [32];
  _Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false> local_80;
  undefined1 local_78 [32];
  _Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false> local_58;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  
  res_id = Module::TakeNextIdBound
                     ((context->module_)._M_t.
                      super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
                      .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl);
  if ((res_id == 0) && ((context->consumer_).super__Function_base._M_manager != (_Manager_type)0x0))
  {
    local_78._0_8_ = (_func_int **)0x25;
    local_a8 = local_a0 + 8;
    local_a8 = (char *)std::__cxx11::string::_M_create((ulong *)&local_a8,(ulong)local_78);
    local_a0._8_8_ = local_78._0_8_;
    builtin_strncpy(local_a8,"ID overflow. Try running compact-ids.",0x25);
    local_a0._0_8_ = local_78._0_8_;
    local_a8[local_78._0_8_] = '\0';
    local_78._0_8_ = (_func_int **)0x0;
    local_78._8_8_ = 0;
    local_78._16_4_ = (array<signed_char,_4UL>)0x0;
    local_78._20_4_ = (array<signed_char,_4UL>)0x0;
    std::function<void_(spv_message_level_t,_const_char_*,_const_spv_position_t_&,_const_char_*)>::
    operator()(&context->consumer_,SPV_MSG_ERROR,"",(spv_position_t *)local_78,local_a8);
    if (local_a8 != local_a0 + 8) {
      operator_delete(local_a8,local_a0._8_8_ + 1);
    }
  }
  this_00 = (Instruction *)operator_new(0x70);
  if ((context->valid_analyses_ & kAnalysisTypes) == kAnalysisNone) {
    IRContext::BuildTypeManager(context);
  }
  this = (context->type_mgr_)._M_t.
         super___uniq_ptr_impl<spvtools::opt::analysis::TypeManager,_std::default_delete<spvtools::opt::analysis::TypeManager>_>
         ._M_t.
         super__Tuple_impl<0UL,_spvtools::opt::analysis::TypeManager_*,_std::default_delete<spvtools::opt::analysis::TypeManager>_>
         .super__Head_base<0UL,_spvtools::opt::analysis::TypeManager_*,_false>._M_head_impl;
  type = TypeManager::GetUIntType(this);
  ty_id = TypeManager::GetTypeInstruction(this,type);
  local_78._24_8_ = local_78 + 0x10;
  local_78._0_8_ = &PTR__SmallVector_00b02ef8;
  local_58._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
  local_78._16_4_ = const_value;
  local_78._8_8_ = 1;
  local_a8 = (char *)CONCAT44(local_a8._4_4_,9);
  local_a0._0_8_ = &PTR__SmallVector_00b02ef8;
  local_a0._8_8_ = 0;
  local_a0._24_8_ = local_a0 + 0x10;
  local_80._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
  utils::SmallVector<unsigned_int,_2UL>::operator=
            ((SmallVector<unsigned_int,_2UL> *)local_a0,(SmallVector<unsigned_int,_2UL> *)local_78);
  local_48 = 0;
  uStack_40 = 0;
  local_38 = 0;
  std::vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>>::
  _M_range_initialize<spvtools::opt::Operand_const*>
            ((vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>> *)&local_48,
             &local_a8,local_78);
  Instruction::Instruction(this_00,context,OpConstant,ty_id,res_id,(OperandList *)&local_48);
  std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector
            ((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)&local_48);
  local_a0._0_8_ = &PTR__SmallVector_00b02ef8;
  if (local_80._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
    std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
              ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
               &local_80,local_80._M_head_impl);
  }
  local_80._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
  local_78._0_8_ = &PTR__SmallVector_00b02ef8;
  if (local_58._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
    std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
              ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
               &local_58,local_58._M_head_impl);
  }
  utils::IntrusiveList<spvtools::opt::Instruction>::push_back
            (&(((context->module_)._M_t.
                super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
                ._M_t.
                super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
                .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl)->types_values_)
              .super_IntrusiveList<spvtools::opt::Instruction>,this_00);
  IRContext::InvalidateAnalyses(context,kAnalysisConstants);
  IRContext::InvalidateAnalyses(context,kAnalysisBegin);
  return res_id;
}

Assistant:

uint32_t AddNewConstInGlobals(IRContext* context, uint32_t const_value) {
  uint32_t id = context->TakeNextId();
  std::unique_ptr<Instruction> new_const(new Instruction(
      context, spv::Op::OpConstant, context->get_type_mgr()->GetUIntTypeId(),
      id,
      {
          {spv_operand_type_t::SPV_OPERAND_TYPE_TYPED_LITERAL_NUMBER,
           {const_value}},
      }));
  context->module()->AddGlobalValue(std::move(new_const));
  context->InvalidateAnalyses(IRContext::kAnalysisConstants);
  context->InvalidateAnalyses(IRContext::kAnalysisDefUse);
  return id;
}